

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
::recover_slot(table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
               *this,uchar *pc)

{
  bool bVar1;
  
  bVar1 = group15<boost::unordered::detail::foa::plain_integral>::maybe_caused_overflow(pc);
  *pc = '\0';
  (this->size_ctrl).ml = (this->size_ctrl).ml - (ulong)bVar1;
  (this->size_ctrl).size = (this->size_ctrl).size - 1;
  return;
}

Assistant:

void recover_slot(unsigned char* pc) {
        /* If this slot potentially caused overflow, we decrease the maximum load
         * so that average probe length won't increase unboundedly in repeated
         * insert/erase cycles (drift).
         */
        size_ctrl.ml -= group_type::maybe_caused_overflow(pc);
        group_type::reset(pc);
        --size_ctrl.size;
    }